

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

int unz64local_GetCurrentFileInfoInternal
              (unzFile file,unz_file_info64 *pfile_info,
              unz_file_info64_internal *pfile_info_internal,char *szFileName,
              uLong fileNameBufferSize,void *extraField,uLong extraFieldBufferSize,char *szComment,
              uLong commentBufferSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  uLong uVar18;
  ZPOS64_T uSizeRead;
  ulong uVar19;
  ZPOS64_T ZVar20;
  uint uVar21;
  uint uVar22;
  bool bVar23;
  uLong dataSize;
  uLong headerId;
  uLong uL;
  uLong uMagic;
  unz_file_info64 file_info;
  unz_file_info64_internal local_108;
  uint local_fc;
  ZPOS64_T local_f8;
  uLong local_f0;
  char *local_e8;
  unz_file_info64 *local_e0;
  unz_file_info64_internal *local_d8;
  uLong local_d0;
  ZPOS64_T local_c8;
  uLong local_c0;
  uLong local_b8;
  uLong local_b0;
  uLong local_a8;
  uLong local_a0;
  uint local_98 [2];
  uLong local_90;
  ZPOS64_T local_88;
  ZPOS64_T local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  uLong local_60;
  uLong local_58;
  uLong local_50;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  
  if (file == (unzFile)0x0) {
    uVar21 = 0xffffff9a;
  }
  else {
    local_f0 = fileNameBufferSize;
    local_e8 = szFileName;
    local_e0 = pfile_info;
    local_d8 = pfile_info_internal;
    lVar16 = call_zseek64((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                          *(long *)((long)file + 0x78) + *(long *)((long)file + 0x88),0);
    local_fc = 0xffffffff;
    if (lVar16 == 0) {
      iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                 &local_c0);
      local_fc = 0xffffffff;
      if (iVar1 == 0) {
        local_fc = 0xffffff99;
        if (local_c0 == 0x2014b50) {
          local_fc = 0;
        }
      }
    }
    iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                &local_b8);
    iVar2 = unz64local_getShort((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                &local_b0);
    iVar3 = unz64local_getShort((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                &local_a8);
    iVar4 = unz64local_getShort((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                &local_a0);
    iVar5 = unz64local_getLong((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                               (uLong *)local_98);
    local_3c = local_98[0] >> 0x10 & 0x1f;
    local_38 = (local_98[0] >> 0x15 & 0xf) - 1;
    local_34 = (local_98[0] >> 0x19) + 0x7bc;
    local_40 = local_98[0] >> 0xb & 0x1f;
    local_44 = local_98[0] >> 5 & 0x3f;
    local_48 = local_98[0] * 2 & 0x3e;
    iVar6 = unz64local_getLong((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                               &local_90);
    iVar7 = unz64local_getLong((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                               &local_c8);
    local_88 = local_c8;
    iVar8 = unz64local_getLong((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                               &local_c8);
    local_80 = local_c8;
    iVar9 = unz64local_getShort((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                &local_78);
    iVar10 = unz64local_getShort((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                 &local_70);
    iVar11 = unz64local_getShort((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                 &local_68);
    iVar12 = unz64local_getShort((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                 &local_60);
    iVar13 = unz64local_getShort((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                 &local_58);
    iVar14 = unz64local_getLong((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                &local_50);
    iVar15 = unz64local_getLong((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                &local_c8);
    uVar21 = 0xffffffff;
    if ((iVar15 == 0 && iVar14 == 0) &&
        ((iVar13 == 0 && iVar12 == 0) &&
        ((iVar11 == 0 && (iVar10 == 0 && (iVar9 == 0 && iVar8 == 0))) &&
        ((iVar7 == 0 && (iVar6 == 0 && iVar5 == 0)) &&
        ((iVar4 == 0 && iVar3 == 0) && (iVar2 == 0 && iVar1 == 0)))))) {
      uVar21 = local_fc;
    }
    local_108.offset_curfile = local_c8;
    ZVar20 = local_78;
    if ((local_e8 != (char *)0x0) && (uVar21 == 0)) {
      uVar19 = local_f0;
      if (local_78 < local_f0) {
        local_e8[local_78] = '\0';
        uVar19 = local_78;
      }
      uVar21 = 0;
      if (local_f0 != 0 && local_78 != 0) {
        uVar17 = (**(code **)((long)file + 8))
                           (*(undefined8 *)((long)file + 0x38),*(undefined8 *)((long)file + 0x60),
                            local_e8,uVar19);
        uVar21 = -(uint)(uVar17 != uVar19);
      }
      ZVar20 = local_78 - uVar19;
    }
    uVar19 = local_70;
    if ((extraField != (void *)0x0) && (uVar21 == 0)) {
      uVar17 = extraFieldBufferSize;
      if (local_70 < extraFieldBufferSize) {
        uVar17 = local_70;
      }
      if (ZVar20 == 0) {
        uVar22 = 0;
        ZVar20 = 0;
      }
      else {
        lVar16 = call_zseek64((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),ZVar20,1
                             );
        if (lVar16 == 0) {
          ZVar20 = 0;
        }
        uVar22 = -(uint)(lVar16 != 0);
      }
      uVar21 = uVar22;
      if (extraFieldBufferSize != 0 && uVar19 != 0) {
        uVar18 = (**(code **)((long)file + 8))
                           (*(undefined8 *)((long)file + 0x38),*(undefined8 *)((long)file + 0x60),
                            extraField,uVar17);
        uVar21 = 0xffffffff;
        if (uVar18 == uVar17) {
          uVar21 = uVar22;
        }
      }
      uVar19 = uVar19 - uVar17;
    }
    ZVar20 = uVar19 + ZVar20;
    if (local_70 != 0 && uVar21 == 0) {
      ZVar20 = ZVar20 - local_70;
      if (ZVar20 == 0) {
        uVar21 = 0;
        ZVar20 = 0;
      }
      else {
        lVar16 = call_zseek64((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),ZVar20,1
                             );
        if (lVar16 == 0) {
          ZVar20 = 0;
        }
        uVar21 = -(uint)(lVar16 != 0);
      }
      if (local_70 != 0) {
        uVar19 = 0;
        do {
          iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                      &local_d0);
          iVar2 = unz64local_getShort((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                      &local_f8);
          if (iVar2 != 0 || iVar1 != 0) {
            uVar21 = 0xffffffff;
          }
          if (local_d0 == 1) {
            if (local_80 == 0xffffffffffffffff) {
              iVar1 = unz64local_getLong64
                                ((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                 &local_80);
              uVar21 = uVar21 | -(uint)(iVar1 != 0);
            }
            if (local_88 == 0xffffffffffffffff) {
              iVar1 = unz64local_getLong64
                                ((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                 &local_88);
              uVar21 = uVar21 | -(uint)(iVar1 != 0);
            }
            if (local_108.offset_curfile == 0xffffffffffffffff) {
              iVar1 = unz64local_getLong64
                                ((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                 &local_108.offset_curfile);
              uVar21 = uVar21 | -(uint)(iVar1 != 0);
            }
            if (local_60 == 0xffffffffffffffff) {
              iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)file,
                                         *(voidpf *)((long)file + 0x60),&local_c8);
              bVar23 = iVar1 != 0;
              goto LAB_001a935e;
            }
          }
          else {
            lVar16 = call_zseek64((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                                  local_f8,1);
            bVar23 = lVar16 != 0;
LAB_001a935e:
            uVar21 = uVar21 | -(uint)bVar23;
          }
          uVar19 = uVar19 + local_f8 + 4;
        } while (uVar19 < local_70);
      }
    }
    if ((szComment != (char *)0x0) && (uVar21 == 0)) {
      uVar19 = commentBufferSize;
      if (local_68 < commentBufferSize) {
        szComment[local_68] = '\0';
        uVar19 = local_68;
      }
      if (ZVar20 == 0) {
        uVar22 = 0;
      }
      else {
        lVar16 = call_zseek64((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),ZVar20,1
                             );
        uVar22 = -(uint)(lVar16 != 0);
      }
      uVar21 = uVar22;
      if (commentBufferSize != 0 && local_68 != 0) {
        uVar18 = (**(code **)((long)file + 8))
                           (*(undefined8 *)((long)file + 0x38),*(undefined8 *)((long)file + 0x60),
                            szComment,uVar19);
        uVar21 = 0xffffffff;
        if (uVar18 == uVar19) {
          uVar21 = uVar22;
        }
      }
    }
    if ((local_e0 != (unz_file_info64 *)0x0) && (uVar21 == 0)) {
      memcpy(local_e0,&local_b8,0x88);
    }
    if ((local_d8 != (unz_file_info64_internal *)0x0) && (uVar21 == 0)) {
      local_d8->offset_curfile = local_108.offset_curfile;
    }
  }
  return uVar21;
}

Assistant:

local int unz64local_GetCurrentFileInfoInternal(unzFile file,
    unz_file_info64* pfile_info,
    unz_file_info64_internal
    * pfile_info_internal,
    char* szFileName,
    uLong fileNameBufferSize,
    void* extraField,
    uLong extraFieldBufferSize,
    char* szComment,
    uLong commentBufferSize)
{
    unz64_s* s;
    unz_file_info64 file_info;
    unz_file_info64_internal file_info_internal;
    int err = UNZ_OK;
    uLong uMagic;
    long lSeek = 0;
    uLong uL;

    if (file == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;
    if (ZSEEK64(s->z_filefunc, s->filestream,
        s->pos_in_central_dir + s->byte_before_the_zipfile,
        ZLIB_FILEFUNC_SEEK_SET) != 0)
        err = UNZ_ERRNO;


    /* we check the magic */
    if (err == UNZ_OK)
    {
        if (unz64local_getLong(&s->z_filefunc, s->filestream, &uMagic) != UNZ_OK)
            err = UNZ_ERRNO;
        else if (uMagic != 0x02014b50)
            err = UNZ_BADZIPFILE;
    }

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.version) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.version_needed) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.flag) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.compression_method) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getLong(&s->z_filefunc, s->filestream, &file_info.dosDate) != UNZ_OK)
        err = UNZ_ERRNO;

    unz64local_DosDateToTmuDate(file_info.dosDate, &file_info.tmu_date);

    if (unz64local_getLong(&s->z_filefunc, s->filestream, &file_info.crc) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getLong(&s->z_filefunc, s->filestream, &uL) != UNZ_OK)
        err = UNZ_ERRNO;
    file_info.compressed_size = uL;

    if (unz64local_getLong(&s->z_filefunc, s->filestream, &uL) != UNZ_OK)
        err = UNZ_ERRNO;
    file_info.uncompressed_size = uL;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.size_filename) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.size_file_extra) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.size_file_comment) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.disk_num_start) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.internal_fa) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getLong(&s->z_filefunc, s->filestream, &file_info.external_fa) != UNZ_OK)
        err = UNZ_ERRNO;

    // relative offset of local header
    if (unz64local_getLong(&s->z_filefunc, s->filestream, &uL) != UNZ_OK)
        err = UNZ_ERRNO;
    file_info_internal.offset_curfile = uL;

    lSeek += file_info.size_filename;
    if ((err == UNZ_OK) && (szFileName != NULL))
    {
        uLong uSizeRead;
        if (file_info.size_filename < fileNameBufferSize)
        {
            *(szFileName + file_info.size_filename) = '\0';
            uSizeRead = file_info.size_filename;
        }
        else
            uSizeRead = fileNameBufferSize;

        if ((file_info.size_filename > 0) && (fileNameBufferSize > 0))
            if (ZREAD64(s->z_filefunc, s->filestream, szFileName, uSizeRead) != uSizeRead)
                err = UNZ_ERRNO;
        lSeek -= uSizeRead;
    }

    // Read extrafield
    if ((err == UNZ_OK) && (extraField != NULL))
    {
        ZPOS64_T uSizeRead;
        if (file_info.size_file_extra < extraFieldBufferSize)
            uSizeRead = file_info.size_file_extra;
        else
            uSizeRead = extraFieldBufferSize;

        if (lSeek != 0)
        {
            if (ZSEEK64(s->z_filefunc, s->filestream, lSeek, ZLIB_FILEFUNC_SEEK_CUR) == 0)
                lSeek = 0;
            else
                err = UNZ_ERRNO;
        }

        if ((file_info.size_file_extra > 0) && (extraFieldBufferSize > 0))
            if (ZREAD64(s->z_filefunc, s->filestream, extraField, (uLong)uSizeRead) != uSizeRead)
                err = UNZ_ERRNO;

        lSeek += file_info.size_file_extra - (uLong)uSizeRead;
    }
    else
        lSeek += file_info.size_file_extra;


    if ((err == UNZ_OK) && (file_info.size_file_extra != 0))
    {
        uLong acc = 0;

        // since lSeek now points to after the extra field we need to move back
        lSeek -= file_info.size_file_extra;

        if (lSeek != 0)
        {
            if (ZSEEK64(s->z_filefunc, s->filestream, lSeek, ZLIB_FILEFUNC_SEEK_CUR) == 0)
                lSeek = 0;
            else
                err = UNZ_ERRNO;
        }

        while (acc < file_info.size_file_extra)
        {
            uLong headerId;
            uLong dataSize;

            if (unz64local_getShort(&s->z_filefunc, s->filestream, &headerId) != UNZ_OK)
                err = UNZ_ERRNO;

            if (unz64local_getShort(&s->z_filefunc, s->filestream, &dataSize) != UNZ_OK)
                err = UNZ_ERRNO;

            /* ZIP64 extra fields */
            if (headerId == 0x0001)
            {
                if (file_info.uncompressed_size == (ZPOS64_T)(unsigned long)-1)
                {
                    if (unz64local_getLong64(&s->z_filefunc, s->filestream, &file_info.uncompressed_size) != UNZ_OK)
                        err = UNZ_ERRNO;
                }

                if (file_info.compressed_size == (ZPOS64_T)(unsigned long)-1)
                {
                    if (unz64local_getLong64(&s->z_filefunc, s->filestream, &file_info.compressed_size) != UNZ_OK)
                        err = UNZ_ERRNO;
                }

                if (file_info_internal.offset_curfile == (ZPOS64_T)(unsigned long)-1)
                {
                    /* Relative Header offset */
                    if (unz64local_getLong64(&s->z_filefunc, s->filestream, &file_info_internal.offset_curfile) != UNZ_OK)
                        err = UNZ_ERRNO;
                }

                if (file_info.disk_num_start == (unsigned long)-1)
                {
                    /* Disk Start Number */
                    if (unz64local_getLong(&s->z_filefunc, s->filestream, &uL) != UNZ_OK)
                        err = UNZ_ERRNO;
                }

            }
            else
            {
                if (ZSEEK64(s->z_filefunc, s->filestream, dataSize, ZLIB_FILEFUNC_SEEK_CUR) != 0)
                    err = UNZ_ERRNO;
            }

            acc += 2 + 2 + dataSize;
        }
    }

    if ((err == UNZ_OK) && (szComment != NULL))
    {
        uLong uSizeRead;
        if (file_info.size_file_comment < commentBufferSize)
        {
            *(szComment + file_info.size_file_comment) = '\0';
            uSizeRead = file_info.size_file_comment;
        }
        else
            uSizeRead = commentBufferSize;

        if (lSeek != 0)
        {
            if (ZSEEK64(s->z_filefunc, s->filestream, lSeek, ZLIB_FILEFUNC_SEEK_CUR) == 0)
                lSeek = 0;
            else
                err = UNZ_ERRNO;
        }

        if ((file_info.size_file_comment > 0) && (commentBufferSize > 0))
            if (ZREAD64(s->z_filefunc, s->filestream, szComment, uSizeRead) != uSizeRead)
                err = UNZ_ERRNO;
        lSeek += file_info.size_file_comment - uSizeRead;
    }
    else
        lSeek += file_info.size_file_comment;


    if ((err == UNZ_OK) && (pfile_info != NULL))
        *pfile_info = file_info;

    if ((err == UNZ_OK) && (pfile_info_internal != NULL))
        *pfile_info_internal = file_info_internal;

    return err;
}